

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UResourceBundle *
ures_getNextResource_63(UResourceBundle *resB,UResourceBundle *fillIn,UErrorCode *status)

{
  uint array;
  uint uVar1;
  Resource RVar2;
  UResourceBundle *pUVar3;
  int indexR;
  char *key;
  
  key = (char *)0x0;
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (resB == (UResourceBundle *)0x0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if (resB->fIndex == resB->fSize + -1) {
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      indexR = resB->fIndex + 1;
      resB->fIndex = indexR;
      array = resB->fRes;
      uVar1 = array >> 0x1c;
      if (uVar1 < 0xf) {
        if ((0x40c3U >> uVar1 & 1) != 0) {
          pUVar3 = ures_copyResb_63(fillIn,resB,status);
          return pUVar3;
        }
        if ((0x34U >> uVar1 & 1) == 0) {
          if ((0x300U >> uVar1 & 1) != 0) {
            RVar2 = res_getArrayItem_63(&resB->fResData,array,indexR);
            fillIn = init_resb_result(&resB->fResData,RVar2,(char *)0x0,resB->fIndex,resB->fData,
                                      resB,0,fillIn,status);
          }
        }
        else {
          RVar2 = res_getTableItemByIndex_63(&resB->fResData,array,indexR,&key);
          fillIn = init_resb_result(&resB->fResData,RVar2,key,resB->fIndex,resB->fData,resB,0,fillIn
                                    ,status);
        }
      }
    }
  }
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 ures_getNextResource(UResourceBundle *resB, UResourceBundle *fillIn, UErrorCode *status) {
    const char *key = NULL;
    Resource r = RES_BOGUS;

    if (status==NULL || U_FAILURE(*status)) {
            /*return NULL;*/
            return fillIn;
    }
    if(resB == NULL) {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            /*return NULL;*/
            return fillIn;
    }

    if(resB->fIndex == resB->fSize-1) {
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
      /*return NULL;*/
    } else {
        resB->fIndex++;
        switch(RES_GET_TYPE(resB->fRes)) {
        case URES_INT:
        case URES_BINARY:
        case URES_STRING:
        case URES_STRING_V2:
        case URES_INT_VECTOR:
            return ures_copyResb(fillIn, resB, status);
        case URES_TABLE:
        case URES_TABLE16:
        case URES_TABLE32:
            r = res_getTableItemByIndex(&(resB->fResData), resB->fRes, resB->fIndex, &key);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return init_resb_result(&(resB->fResData), r, key, resB->fIndex, resB->fData, resB, 0, fillIn, status);
        case URES_ARRAY:
        case URES_ARRAY16:
            r = res_getArrayItem(&(resB->fResData), resB->fRes, resB->fIndex);
            if(r == RES_BOGUS && resB->fHasFallback) {
                /* TODO: do the fallback */
            }
            return init_resb_result(&(resB->fResData), r, key, resB->fIndex, resB->fData, resB, 0, fillIn, status);
        default:
            /*return NULL;*/
            return fillIn;
        }
    }
    /*return NULL;*/
    return fillIn;
}